

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

bool __thiscall gl4cts::ShaderSubroutine::FunctionalTest12::testImage(FunctionalTest12 *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  GLuint subroutine_index;
  GLuint subroutine_index_00;
  GLuint GVar6;
  socklen_t sVar7;
  sockaddr *__addr;
  sockaddr *__addr_00;
  int iVar8;
  texture *texture;
  FunctionalTest12 *this_00;
  texture destination_texture;
  texture red_texture;
  framebuffer framebuffer;
  texture blue_texture;
  vertexArray vao;
  texture color_texture;
  program program;
  
  destination_texture.m_context = (this->super_TestCase).m_context;
  blue_texture.m_id = 0;
  destination_texture.m_id = 0;
  color_texture.m_id = 0;
  framebuffer.m_id = 0;
  program.m_tesselation_control_shader_id = 0;
  program.m_tesselation_evaluation_shader_id = 0;
  program.m_vertex_shader_id = 0;
  program.m_compute_shader_id = 0;
  program.m_fragment_shader_id = 0;
  program.m_geometry_shader_id = 0;
  program.m_program_object_id = 0;
  red_texture.m_id = 0;
  vao.m_id = 0;
  sVar7 = 0x16adf89;
  iVar8 = 0;
  red_texture.m_context = destination_texture.m_context;
  framebuffer.m_context = destination_texture.m_context;
  blue_texture.m_context = destination_texture.m_context;
  vao.m_context = destination_texture.m_context;
  color_texture.m_context = destination_texture.m_context;
  program.m_context = destination_texture.m_context;
  Utils::program::build
            (&program,(GLchar *)0x0,
             "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n#extension GL_ARB_shader_subroutine       : require\n\nprecision highp float;\n\nlayout(location = 0) out uvec4 out_color;\n\nlayout(rgba32ui) uniform uimage2D left_image;\nlayout(rgba32ui) uniform uimage2D right_image;\n\nsubroutine void image_routine(void);\n\nsubroutine(image_routine) void left_to_right(void)\n{\n    out_color = imageLoad (left_image,  ivec2(gl_FragCoord.xy));\n                imageStore(right_image, ivec2(gl_FragCoord.xy), out_color);\n}\n\nsubroutine(image_routine) void right_to_left(void)\n{\n    out_color = imageLoad (right_image, ivec2(gl_FragCoord.xy));\n                imageStore(left_image,  ivec2(gl_FragCoord.xy), out_color);\n}\n\nsubroutine uniform image_routine routine;\n\nvoid main()\n{\n    routine();\n}\n\n"
             ,
             "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\nlayout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nvoid main()\n{\n    gl_Position = vec4(-1, -1, 0, 1);\n    EmitVertex();\n    \n    gl_Position = vec4(-1,  1, 0, 1);\n    EmitVertex();\n    \n    gl_Position = vec4( 1, -1, 0, 1);\n    EmitVertex();\n    \n    gl_Position = vec4( 1,  1, 0, 1);\n    EmitVertex();\n    \n    EndPrimitive();\n}\n\n"
             ,(GLchar *)0x0,(GLchar *)0x0,
             "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\nvoid main()\n{\n}\n\n"
             ,(GLchar **)0x0,0,false);
  Utils::program::use(&program);
  Utils::vertexArray::generate(&vao);
  Utils::vertexArray::bind(&vao,iVar8,__addr,sVar7);
  Utils::texture::create(&blue_texture,0x10,0x10,0x8d70);
  Utils::texture::create(&destination_texture,0x10,0x10,0x8d70);
  Utils::texture::create(&color_texture,0x10,0x10,0x8d70);
  this_00 = (FunctionalTest12 *)&red_texture;
  sVar7 = 0x8d70;
  Utils::texture::create((texture *)this_00,0x10,0x10,0x8d70);
  fillTexture(this_00,&blue_texture,testImage::blue_color);
  fillTexture(this_00,&destination_texture,testImage::clean_color);
  texture = &red_texture;
  fillTexture(this_00,texture,testImage::red_color);
  iVar8 = (int)texture;
  Utils::framebuffer::generate(&framebuffer);
  Utils::framebuffer::bind(&framebuffer,iVar8,__addr_00,sVar7);
  Utils::framebuffer::attachTexture(&framebuffer,0x8ce0,color_texture.m_id,0x10,0x10);
  Utils::framebuffer::clearColor(&framebuffer,0.0,0.0,0.0,0.0);
  Utils::framebuffer::clear(&framebuffer,0x4000);
  subroutine_index = Utils::program::getSubroutineIndex(&program,"left_to_right",0x8b30);
  subroutine_index_00 = Utils::program::getSubroutineIndex(&program,"right_to_left",0x8b30);
  GVar6 = Utils::program::getUniformLocation(&program,"left_image");
  this->m_left_image = GVar6;
  GVar6 = Utils::program::getUniformLocation(&program,"right_image");
  this->m_right_image = GVar6;
  bVar1 = testImageDraw(this,subroutine_index,&blue_texture,&destination_texture,
                        testImage::blue_color,testImage::blue_color);
  bVar2 = testImageDraw(this,subroutine_index,&red_texture,&destination_texture,testImage::red_color
                        ,testImage::red_color);
  bVar3 = testImageDraw(this,subroutine_index_00,&destination_texture,&blue_texture,
                        testImage::blue_color,testImage::blue_color);
  bVar4 = testImageDraw(this,subroutine_index_00,&destination_texture,&red_texture,
                        testImage::red_color,testImage::red_color);
  bVar5 = testImageDraw(this,subroutine_index,&blue_texture,&red_texture,testImage::blue_color,
                        testImage::blue_color);
  Utils::vertexArray::~vertexArray(&vao);
  Utils::texture::~texture(&red_texture);
  Utils::program::~program(&program);
  Utils::framebuffer::~framebuffer(&framebuffer);
  Utils::texture::~texture(&color_texture);
  Utils::texture::~texture(&destination_texture);
  Utils::texture::~texture(&blue_texture);
  return ((bVar3 && bVar4) && (bVar1 && bVar2)) && bVar5;
}

Assistant:

bool FunctionalTest12::testImage()
{
	static const GLchar* fragment_shader_code =
		"#version 400 core\n"
		"#extension GL_ARB_shader_image_load_store : require\n"
		"#extension GL_ARB_shader_subroutine       : require\n"
		"\n"
		"precision highp float;\n"
		"\n"
		"layout(location = 0) out uvec4 out_color;\n"
		"\n"
		"layout(rgba32ui) uniform uimage2D left_image;\n"
		"layout(rgba32ui) uniform uimage2D right_image;\n"
		"\n"
		"subroutine void image_routine(void);\n"
		"\n"
		"subroutine(image_routine) void left_to_right(void)\n"
		"{\n"
		"    out_color = imageLoad (left_image,  ivec2(gl_FragCoord.xy));\n"
		"                imageStore(right_image, ivec2(gl_FragCoord.xy), out_color);\n"
		"}\n"
		"\n"
		"subroutine(image_routine) void right_to_left(void)\n"
		"{\n"
		"    out_color = imageLoad (right_image, ivec2(gl_FragCoord.xy));\n"
		"                imageStore(left_image,  ivec2(gl_FragCoord.xy), out_color);\n"
		"}\n"
		"\n"
		"subroutine uniform image_routine routine;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    routine();\n"
		"}\n"
		"\n";

	static const GLchar* geometry_shader_code = "#version 400 core\n"
												"#extension GL_ARB_shader_subroutine : require\n"
												"\n"
												"precision highp float;\n"
												"\n"
												"layout(points)                           in;\n"
												"layout(triangle_strip, max_vertices = 4) out;\n"
												"\n"
												"void main()\n"
												"{\n"
												"    gl_Position = vec4(-1, -1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4(-1,  1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4( 1, -1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4( 1,  1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    EndPrimitive();\n"
												"}\n"
												"\n";

	static const GLchar* vertex_shader_code = "#version 400 core\n"
											  "#extension GL_ARB_shader_subroutine : require\n"
											  "\n"
											  "precision highp float;\n"
											  "\n"
											  "void main()\n"
											  "{\n"
											  "}\n"
											  "\n";

	static const GLchar* subroutine_names[] = { "left_to_right", "right_to_left" };

	static const GLchar* uniform_names[] = { "left_image", "right_image" };

	/* Test data */
	static const GLuint blue_color[4]  = { 0, 0, 255, 255 };
	static const GLuint clean_color[4] = { 16, 32, 64, 128 };
	static const GLuint red_color[4]   = { 255, 0, 0, 255 };

	/* GL objects */
	Utils::texture	 blue_texture(m_context);
	Utils::texture	 destination_texture(m_context);
	Utils::texture	 color_texture(m_context);
	Utils::framebuffer framebuffer(m_context);
	Utils::program	 program(m_context);
	Utils::texture	 red_texture(m_context);
	Utils::vertexArray vao(m_context);

	/* Init GL objects */
	program.build(0 /* cs */, fragment_shader_code /* fs */, geometry_shader_code /* gs */, 0 /* tcs */, 0 /* test */,
				  vertex_shader_code, 0 /* varying_names */, 0 /* n_varyings */);

	program.use();

	vao.generate();
	vao.bind();

	blue_texture.create(m_texture_width, m_texture_height, GL_RGBA32UI);
	destination_texture.create(m_texture_width, m_texture_height, GL_RGBA32UI);
	color_texture.create(m_texture_width, m_texture_height, GL_RGBA32UI);
	red_texture.create(m_texture_width, m_texture_height, GL_RGBA32UI);

	fillTexture(blue_texture, blue_color);
	fillTexture(destination_texture, clean_color);
	fillTexture(red_texture, red_color);

	framebuffer.generate();
	framebuffer.bind();
	framebuffer.attachTexture(GL_COLOR_ATTACHMENT0, color_texture.m_id, m_texture_width, m_texture_height);
	framebuffer.clearColor(0.0f, 0.0f, 0.0f, 0.0f);
	framebuffer.clear(GL_COLOR_BUFFER_BIT);

	/* Subroutine indices */
	GLuint left_to_right = program.getSubroutineIndex(subroutine_names[0], GL_FRAGMENT_SHADER);
	GLuint right_to_left = program.getSubroutineIndex(subroutine_names[1], GL_FRAGMENT_SHADER);

	/* Uniform locations */
	m_left_image  = program.getUniformLocation(uniform_names[0]);
	m_right_image = program.getUniformLocation(uniform_names[1]);

	/* Test */
	bool result = true;

	if (false == testImageDraw(left_to_right, blue_texture, destination_texture, blue_color, blue_color))
	{
		result = false;
	}

	if (false == testImageDraw(left_to_right, red_texture, destination_texture, red_color, red_color))
	{
		result = false;
	}

	if (false == testImageDraw(right_to_left, destination_texture, blue_texture, blue_color, blue_color))
	{
		result = false;
	}

	if (false == testImageDraw(right_to_left, destination_texture, red_texture, red_color, red_color))
	{
		result = false;
	}

	if (false == testImageDraw(left_to_right, blue_texture, red_texture, blue_color, blue_color))
	{
		result = false;
	}

	/* Done */
	return result;
}